

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O2

void __thiscall despot::BaseTag::ReadConfig(BaseTag *this,istream *is)

{
  bool bVar1;
  istream *piVar2;
  istream *piVar3;
  int y;
  int iVar4;
  BaseTag *this_00;
  int x;
  long lVar5;
  int ncols;
  istream *local_250;
  int o;
  int w;
  BaseTag *local_240;
  Coord local_238 [8];
  string line;
  int nrows;
  string val;
  string key;
  istringstream iss;
  
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  key._M_dataplus._M_p = (pointer)&key.field_2;
  key._M_string_length = 0;
  val._M_dataplus._M_p = (pointer)&val.field_2;
  val._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  key.field_2._M_local_buf[0] = '\0';
  val.field_2._M_local_buf[0] = '\0';
  local_250 = is;
  local_240 = this;
  while( true ) {
    piVar2 = std::operator>>(local_250,(string *)&key);
    piVar2 = std::operator>>(piVar2,(string *)&val);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    bVar1 = std::operator==(&key,"mapSize");
    if (bVar1) {
      piVar3 = (istream *)std::istream::operator>>((istream *)local_250,&nrows);
      std::istream::operator>>(piVar3,&ncols);
      despot::Floor::Floor((Floor *)&iss,nrows,ncols);
      Floor::operator=(&this->floor_,(Floor *)&iss);
      Floor::~Floor((Floor *)&iss);
      for (iVar4 = 0; iVar4 < nrows; iVar4 = iVar4 + 1) {
        std::operator>>(local_250,(string *)&line);
        for (lVar5 = 0; lVar5 < ncols; lVar5 = lVar5 + 1) {
          if (line._M_dataplus._M_p[lVar5] != '#') {
            despot::Coord::Coord(local_238,(int)lVar5,iVar4);
            despot::Floor::AddCell(&this->floor_,local_238);
          }
        }
      }
      despot::Floor::ComputeDistances();
    }
    else {
      bVar1 = std::operator==(&key,"width-height-obstacles");
      if (bVar1) {
        piVar3 = (istream *)std::istream::operator>>((istream *)local_250,&ncols);
        piVar3 = (istream *)std::istream::operator>>(piVar3,&w);
        this_00 = (BaseTag *)&o;
        std::istream::operator>>(piVar3,(int *)this_00);
        RandomMap_abi_cxx11_((string *)&nrows,this_00,ncols,w,o);
        std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&nrows,_S_in);
        std::__cxx11::string::~string((string *)&nrows);
        ReadConfig(local_240,(istream *)&iss);
        std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
      }
    }
  }
  std::__cxx11::string::~string((string *)&val);
  std::__cxx11::string::~string((string *)&key);
  std::__cxx11::string::~string((string *)&line);
  return;
}

Assistant:

void BaseTag::ReadConfig(istream& is) {
	string line, key, val;
	while (is >> key >> val) {
		if (key == "mapSize") {
			int nrows, ncols;
			is >> nrows >> ncols;
			floor_ = Floor(nrows, ncols);

			for (int y = 0; y < nrows; y++) {
				is >> line;
				for (int x = 0; x < ncols; x++) {
					if (line[x] != '#') {
						floor_.AddCell(Coord(x, y));
					}
				}
			}

			floor_.ComputeDistances();
		} else if (key == "width-height-obstacles") {
			int h, w, o;
			is >> h >> w >> o;
			istringstream iss(RandomMap(h, w, o));
			ReadConfig(iss);
		}
	}
}